

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O1

int Abc_CommandPdrAbs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  Wlc_Par_t Pars;
  Wlc_Par_t local_a0;
  Wlc_Ntk_t *local_38;
  
  local_38 = (Wlc_Ntk_t *)pAbc->pAbcWlc;
  Wlc_ManSetDefaultParams(&local_a0);
  Extra_UtilGetoptReset();
LAB_0035529b:
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"AMXFILabrcdilpqmstuxvwh");
    iVar1 = globalUtilOptind;
    switch(iVar2) {
    case 0x46:
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-F\" should be followed by an integer.\n";
LAB_00355472:
        Abc_Print(-1,pcVar4);
        goto switchD_003552b7_caseD_47;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_a0.nBitsFlop = uVar3;
      break;
    case 0x47:
    case 0x48:
    case 0x4a:
    case 0x4b:
    case 0x4e:
    case 0x4f:
    case 0x50:
    case 0x51:
    case 0x52:
    case 0x53:
    case 0x54:
    case 0x55:
    case 0x56:
    case 0x57:
    case 0x59:
    case 0x5a:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x5f:
    case 0x60:
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6e:
    case 0x6f:
      goto switchD_003552b7_caseD_47;
    case 0x49:
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-I\" should be followed by an integer.\n";
        goto LAB_00355472;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_a0.nIterMax = uVar3;
      break;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-L\" should be followed by an integer.\n";
        goto LAB_00355472;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_a0.nLimit = uVar3;
      break;
    case 0x4d:
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-M\" should be followed by an integer.\n";
        goto LAB_00355472;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_a0.nBitsMul = uVar3;
      break;
    case 0x58:
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-X\" should be followed by an integer.\n";
        goto LAB_00355472;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_a0.nBitsMux = uVar3;
      break;
    case 0x61:
      local_a0.fPdra = local_a0.fPdra ^ 1;
      goto LAB_0035529b;
    case 0x62:
      local_a0.fProofRefine = local_a0.fProofRefine ^ 1;
      goto LAB_0035529b;
    case 99:
      local_a0.fCheckClauses = local_a0.fCheckClauses ^ 1;
      goto LAB_0035529b;
    case 100:
      local_a0.fAbs2 = local_a0.fAbs2 ^ 1;
      goto LAB_0035529b;
    case 0x69:
      local_a0.fProofUsePPI = local_a0.fProofUsePPI ^ 1;
      goto LAB_0035529b;
    case 0x6c:
      local_a0.fLoadTrace = local_a0.fLoadTrace ^ 1;
      goto LAB_0035529b;
    case 0x6d:
      local_a0.fMFFC = local_a0.fMFFC ^ 1;
      goto LAB_0035529b;
    case 0x70:
      local_a0.fPushClauses = local_a0.fPushClauses ^ 1;
      goto LAB_0035529b;
    case 0x71:
      local_a0.fUseBmc3 = local_a0.fUseBmc3 ^ 1;
      goto LAB_0035529b;
    case 0x72:
      local_a0.fHybrid = local_a0.fHybrid ^ 1;
      goto LAB_0035529b;
    case 0x73:
      local_a0.fShrinkAbs = local_a0.fShrinkAbs ^ 1;
      goto LAB_0035529b;
    case 0x74:
      local_a0.fShrinkScratch = local_a0.fShrinkScratch ^ 1;
      goto LAB_0035529b;
    case 0x75:
      local_a0.fCheckCombUnsat = local_a0.fCheckCombUnsat ^ 1;
      goto LAB_0035529b;
    case 0x76:
      local_a0.fVerbose = local_a0.fVerbose ^ 1;
      goto LAB_0035529b;
    case 0x77:
      local_a0.fPdrVerbose = local_a0.fPdrVerbose ^ 1;
      goto LAB_0035529b;
    case 0x78:
      local_a0.fXorOutput = local_a0.fXorOutput ^ 1;
      goto LAB_0035529b;
    default:
      if (iVar2 != 0x41) {
        if (iVar2 == -1) {
          if (local_38 != (Wlc_Ntk_t *)0x0) {
            Wlc_NtkPdrAbs(local_38,&local_a0);
            return 0;
          }
          Abc_Print(1,"Abc_CommandCone(): There is no current design.\n");
          return 0;
        }
        goto switchD_003552b7_caseD_47;
      }
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-A\" should be followed by an integer.\n";
        goto LAB_00355472;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_a0.nBitsAdd = uVar3;
    }
    globalUtilOptind = iVar1 + 1;
    if ((int)uVar3 < 0) {
switchD_003552b7_caseD_47:
      Abc_Print(-2,"usage: %%pdra [-AMXFIL num] [-abrcdilpqmxstuvwh]\n");
      Abc_Print(-2,"\t         abstraction for word-level networks\n");
      Abc_Print(-2,
                "\t-A num : minimum bit-width of an adder/subtractor to abstract [default = %d]\n",
                (ulong)(uint)local_a0.nBitsAdd);
      Abc_Print(-2,"\t-M num : minimum bit-width of a multiplier to abstract [default = %d]\n",
                (ulong)(uint)local_a0.nBitsMul);
      Abc_Print(-2,"\t-X num : minimum bit-width of a MUX operator to abstract [default = %d]\n",
                (ulong)(uint)local_a0.nBitsMux);
      Abc_Print(-2,"\t-F num : minimum bit-width of a flip-flop to abstract [default = %d]\n",
                (ulong)(uint)local_a0.nBitsFlop);
      Abc_Print(-2,"\t-I num : maximum number of CEGAR iterations [default = %d]\n",
                (ulong)(uint)local_a0.nIterMax);
      Abc_Print(-2,"\t-L num : maximum number of each type of signals [default = %d]\n",
                (ulong)(uint)local_a0.nLimit);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (local_a0.fXorOutput == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-x     : toggle XORing outputs of word-level miter [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_a0.fPdra == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-a     : toggle running pdr with -nct [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_a0.fProofRefine == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-b     : toggle using proof-based refinement [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_a0.fHybrid == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,
                "\t-r     : toggle using both cex-based and proof-based refinement [default = %s]\n"
                ,pcVar4);
      pcVar4 = "yes";
      if (local_a0.fCheckClauses == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-c     : toggle checking clauses in the reloaded trace [default = %s]\n",
                pcVar4);
      pcVar4 = "yes";
      if (local_a0.fAbs2 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-d     : toggle using another way of creating abstractions [default = %s]\n",
                pcVar4);
      pcVar4 = "yes";
      if (local_a0.fProofUsePPI == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-i     : toggle using PPI values in proof-based refinement [default = %s]\n",
                pcVar4);
      pcVar4 = "yes";
      if (local_a0.fLoadTrace == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-l     : toggle loading previous PDR traces [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_a0.fShrinkAbs == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle shrinking abstractions with BMC [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_a0.fShrinkScratch == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,
                "\t-t     : toggle restarting pdr from scratch after shrinking abstractions with BMC [default = %s]\n"
                ,pcVar4);
      pcVar4 = "yes";
      if (local_a0.fCheckCombUnsat == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-u     : toggle checking combinationally unsat [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_a0.fPushClauses == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-p     : toggle pushing clauses in the reloaded trace [default = %s]\n",pcVar4
               );
      pcVar4 = "yes";
      if (local_a0.fUseBmc3 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-q     : toggle running bmc3 in parallel for CEX [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_a0.fMFFC == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-m     : toggle refining the whole MFFC of a PPI [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_a0.fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
      if (local_a0.fPdrVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-w     : toggle printing verbose PDR output [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandPdrAbs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    Wlc_Par_t Pars, * pPars = &Pars;
    int c;
    Wlc_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "AMXFILabrcdilpqmstuxvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBitsAdd = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBitsAdd < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBitsMul = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBitsMul < 0 )
                goto usage;
            break;
        case 'X':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-X\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBitsMux = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBitsMux < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBitsFlop = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBitsFlop < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nIterMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIterMax < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLimit < 0 )
                goto usage;
            break;
        case 'a':
            pPars->fPdra ^= 1;
            break;
        case 'b':
            pPars->fProofRefine ^= 1;
            break;
        case 'r':
            pPars->fHybrid ^= 1;
            break;
        case 'x':
            pPars->fXorOutput ^= 1;
            break;
        case 'c':
            pPars->fCheckClauses ^= 1;
            break;
        case 'd':
            pPars->fAbs2 ^= 1;
            break;
        case 'i':
            pPars->fProofUsePPI ^= 1;
            break;
        case 'l':
            pPars->fLoadTrace ^= 1;
            break;
        case 'p':
            pPars->fPushClauses ^= 1;
            break;
        case 'q':
            pPars->fUseBmc3 ^= 1;
            break;
        case 'm':
            pPars->fMFFC ^= 1;
            break;
        case 's':
            pPars->fShrinkAbs ^= 1;
            break;
        case 't':
            pPars->fShrinkScratch ^= 1;
            break;
        case 'u':
            pPars->fCheckCombUnsat ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fPdrVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Abc_CommandCone(): There is no current design.\n" );
        return 0;
    }
    Wlc_NtkPdrAbs( pNtk, pPars );
    return 0;
usage:
    Abc_Print( -2, "usage: %%pdra [-AMXFIL num] [-abrcdilpqmxstuvwh]\n" );
    Abc_Print( -2, "\t         abstraction for word-level networks\n" );
    Abc_Print( -2, "\t-A num : minimum bit-width of an adder/subtractor to abstract [default = %d]\n", pPars->nBitsAdd );
    Abc_Print( -2, "\t-M num : minimum bit-width of a multiplier to abstract [default = %d]\n",        pPars->nBitsMul );
    Abc_Print( -2, "\t-X num : minimum bit-width of a MUX operator to abstract [default = %d]\n",      pPars->nBitsMux );
    Abc_Print( -2, "\t-F num : minimum bit-width of a flip-flop to abstract [default = %d]\n",         pPars->nBitsFlop );
    Abc_Print( -2, "\t-I num : maximum number of CEGAR iterations [default = %d]\n",                   pPars->nIterMax );
    Abc_Print( -2, "\t-L num : maximum number of each type of signals [default = %d]\n",               pPars->nLimit );
    Abc_Print( -2, "\t-x     : toggle XORing outputs of word-level miter [default = %s]\n",            pPars->fXorOutput? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle running pdr with -nct [default = %s]\n",                         pPars->fPdra? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggle using proof-based refinement [default = %s]\n",                  pPars->fProofRefine? "yes": "no" );
    Abc_Print( -2, "\t-r     : toggle using both cex-based and proof-based refinement [default = %s]\n",                  pPars->fHybrid? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle checking clauses in the reloaded trace [default = %s]\n",        pPars->fCheckClauses? "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle using another way of creating abstractions [default = %s]\n",    pPars->fAbs2? "yes": "no" );
    Abc_Print( -2, "\t-i     : toggle using PPI values in proof-based refinement [default = %s]\n",    pPars->fProofUsePPI? "yes": "no" );
    Abc_Print( -2, "\t-l     : toggle loading previous PDR traces [default = %s]\n",                   pPars->fLoadTrace? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle shrinking abstractions with BMC [default = %s]\n",               pPars->fShrinkAbs? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle restarting pdr from scratch after shrinking abstractions with BMC [default = %s]\n",               pPars->fShrinkScratch? "yes": "no" );
    Abc_Print( -2, "\t-u     : toggle checking combinationally unsat [default = %s]\n",                pPars->fCheckCombUnsat? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle pushing clauses in the reloaded trace [default = %s]\n",         pPars->fPushClauses? "yes": "no" );
    Abc_Print( -2, "\t-q     : toggle running bmc3 in parallel for CEX [default = %s]\n",              pPars->fUseBmc3? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle refining the whole MFFC of a PPI [default = %s]\n",              pPars->fMFFC? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",                  pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing verbose PDR output [default = %s]\n",                   pPars->fPdrVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}